

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes
          (SocketData *this,SocketType sock,int availLen,bool *complete,RTPMemoryManager *pMgr)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar8 = this->m_lengthBufferOffset;
  if ((long)iVar8 < 2) {
    if (this->m_pDataBuffer != (uint8_t *)0x0) {
      __assert_fail("m_pDataBuffer == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astronautlabs[P]rtp/src/rtptcptransmitter.cpp"
                    ,0x365,
                    "int jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType, int, bool &, RTPMemoryManager *)"
                   );
    }
    uVar2 = 2U - iVar8;
    if (availLen <= (int)(2U - iVar8)) {
      uVar2 = availLen;
    }
    if ((int)uVar2 < 1) {
      iVar7 = 0;
LAB_0013ac75:
      iVar8 = iVar8 + iVar7;
      this->m_lengthBufferOffset = iVar8;
      if (2 < iVar8) {
        __assert_fail("m_lengthBufferOffset <= numLengthBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/astronautlabs[P]rtp/src/rtptcptransmitter.cpp"
                      ,0x375,
                      "int jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType, int, bool &, RTPMemoryManager *)"
                     );
      }
      if (iVar8 != 2) {
        return 0;
      }
      uVar1 = *(ushort *)this->m_lengthBuffer << 8 | *(ushort *)this->m_lengthBuffer >> 8;
      this->m_dataLength = (uint)uVar1;
      this->m_dataBufferOffset = 0;
      puVar5 = (uint8_t *)operator_new__((ulong)((uint)uVar1 + (uint)(uVar1 == 0)),pMgr,1);
      this->m_pDataBuffer = puVar5;
      if (puVar5 == (uint8_t *)0x0) {
        return -1;
      }
      availLen = availLen - iVar7;
      iVar8 = this->m_lengthBufferOffset;
      goto LAB_0013acc9;
    }
    sVar4 = recv(sock,this->m_lengthBuffer + iVar8,(ulong)uVar2,0);
    iVar7 = (int)sVar4;
    if (-1 < iVar7) {
      iVar8 = this->m_lengthBufferOffset;
      goto LAB_0013ac75;
    }
LAB_0013ad14:
    iVar7 = -0xc5;
  }
  else {
LAB_0013acc9:
    iVar7 = 0;
    if (iVar8 != 2) {
      return 0;
    }
    if (this->m_pDataBuffer == (uint8_t *)0x0) {
      return 0;
    }
    iVar8 = this->m_dataLength;
    iVar6 = this->m_dataBufferOffset;
    uVar2 = iVar8 - iVar6;
    if (uVar2 != 0 && iVar6 <= iVar8) {
      if ((int)uVar2 < availLen) {
        availLen = uVar2;
      }
      if (availLen < 1) {
        iVar3 = 0;
      }
      else {
        sVar4 = recv(sock,this->m_pDataBuffer + iVar6,(ulong)(uint)availLen,0);
        iVar3 = (int)sVar4;
        if (iVar3 < 0) goto LAB_0013ad14;
        iVar8 = this->m_dataLength;
        iVar6 = this->m_dataBufferOffset;
      }
      iVar6 = iVar6 + iVar3;
      this->m_dataBufferOffset = iVar6;
    }
    if (iVar6 == iVar8) {
      *complete = true;
    }
  }
  return iVar7;
}

Assistant:

int RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType sock, int availLen, bool &complete, RTPMemoryManager *pMgr)
{
	JRTPLIB_UNUSED(pMgr); // possibly unused

	const int numLengthBuffer = 2;
	if (m_lengthBufferOffset < numLengthBuffer) // first we need to get the length
	{
		assert(m_pDataBuffer == 0);
		int num = numLengthBuffer-m_lengthBufferOffset;
		if (num > availLen)
			num = availLen;

		int r = 0;
		if (num > 0)
		{
			r = (int)recv(sock, (char *)(m_lengthBuffer+m_lengthBufferOffset), num, 0);
			if (r < 0)
				return ERR_RTP_TCPTRANS_ERRORINRECV;
		}

		m_lengthBufferOffset += r;
		availLen -= r;

		assert(m_lengthBufferOffset <= numLengthBuffer);
		if (m_lengthBufferOffset == numLengthBuffer) // we can constuct a length
		{
			int l = 0;
			for (int i = numLengthBuffer-1, shift = 0 ; i >= 0 ; i--, shift += 8)
				l |= ((int)m_lengthBuffer[i]) << shift;

			m_dataLength = l;
			m_dataBufferOffset = 0;

			//cout << "Expecting " << m_dataLength << " bytes" << endl;

			// avoid allocation of length 0
			if (l == 0)
				l = 1;

			// We don't yet know if it's an RTP or RTCP packet, so we'll stick to RTP
			m_pDataBuffer = RTPNew(pMgr, RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET) uint8_t[l];
			if (m_pDataBuffer == 0)
				return ERR_RTP_OUTOFMEM;
		}
	}

	if (m_lengthBufferOffset == numLengthBuffer && m_pDataBuffer) // the last one is to make sure we didn't run out of memory
	{
		if (m_dataBufferOffset < m_dataLength)
		{
			int num = m_dataLength-m_dataBufferOffset;
			if (num > availLen)
				num = availLen;

			int r = 0;
			if (num > 0)
			{
				r = (int)recv(sock, (char *)(m_pDataBuffer+m_dataBufferOffset), num, 0);
				if (r < 0)
					return ERR_RTP_TCPTRANS_ERRORINRECV;
			}

			m_dataBufferOffset += r;
			availLen -= r;
		}

		if (m_dataBufferOffset == m_dataLength)
			complete = true;
	}
	return 0;
}